

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_ObjCollectCopyFanins(Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  ushort uVar1;
  int iVar2;
  Wlc_Obj_t *p_00;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  
  p_00 = Wlc_NtkObj(p,iObj);
  vFanins->nSize = 0;
  for (iVar4 = 0; iVar4 < (int)p_00->nFanins; iVar4 = iVar4 + 1) {
    iVar2 = Wlc_ObjFaninId(p_00,iVar4);
    iVar2 = Vec_IntEntry(&p->vCopies,iVar2);
    Vec_IntPush(vFanins,iVar2);
  }
  uVar1 = *(ushort *)p_00 & 0x3f;
  if (uVar1 == 0x35) {
    if (vFanins->nSize != 1) {
      __assert_fail("Vec_IntSize(vFanins) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                    ,0x39e,"void Wlc_ObjCollectCopyFanins(Wlc_Ntk_t *, int, Vec_Int_t *)");
    }
    iVar4 = (p_00->field_10).Fanins[1];
  }
  else {
    if (uVar1 != 0x16) {
      if (uVar1 == 6) {
        piVar3 = Wlc_ObjConstValue(p_00);
        iVar2 = p_00->End - p_00->Beg;
        iVar4 = -iVar2;
        if (0 < iVar2) {
          iVar4 = iVar2;
        }
        for (uVar5 = 0; (((iVar4 + 1U >> 5) + 1) - (uint)((iVar4 + 1U & 0x1f) == 0)) * 4 != uVar5;
            uVar5 = uVar5 + 4) {
          Vec_IntPush(vFanins,*(int *)((long)piVar3 + uVar5));
        }
      }
      return;
    }
    if (vFanins->nSize != 1) {
      __assert_fail("Vec_IntSize(vFanins) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                    ,0x399,"void Wlc_ObjCollectCopyFanins(Wlc_Ntk_t *, int, Vec_Int_t *)");
    }
    iVar4 = (p_00->field_10).pFanins[0][2];
    Vec_IntPush(vFanins,(p_00->field_10).pFanins[0][1]);
  }
  Vec_IntPush(vFanins,iVar4);
  return;
}

Assistant:

void Wlc_ObjCollectCopyFanins( Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    int i, iFanin;
    Wlc_Obj_t * pObj = Wlc_NtkObj( p, iObj );
    Vec_IntClear( vFanins );
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Vec_IntPush( vFanins, Wlc_ObjCopy(p, iFanin) );
    // special treatment of CONST and SELECT
    if ( pObj->Type == WLC_OBJ_CONST )
    {
        int * pInts = Wlc_ObjConstValue( pObj );
        int nInts = Abc_BitWordNum( Wlc_ObjRange(pObj) );
        for ( i = 0; i < nInts; i++ )
            Vec_IntPush( vFanins, pInts[i] );
    }
    else if ( pObj->Type == WLC_OBJ_BIT_SELECT )
    {
        assert( Vec_IntSize(vFanins) == 1 );
        Vec_IntPushTwo( vFanins, Wlc_ObjRangeEnd(pObj), Wlc_ObjRangeBeg(pObj) );
    }
    else if ( pObj->Type == WLC_OBJ_TABLE )
    {
        assert( Vec_IntSize(vFanins) == 1 );
        Vec_IntPush( vFanins, pObj->Fanins[1] );
    }
}